

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

int __thiscall
NNTreeImpl::compareKeyKid(NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *kids,int idx)

{
  QPDF *qpdf;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  undefined8 extraout_RAX;
  uint uVar6;
  size_type *psVar7;
  ulong uVar8;
  uint __val;
  uint __len;
  string __str;
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  string local_80;
  QPDFObjectHandle local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar2 = QPDFObjectHandle::isArray(kids);
  if (bVar2) {
    iVar4 = QPDFObjectHandle::getArrayNItems(kids);
    if (idx < iVar4) {
      QPDFObjectHandle::getArrayItem(&local_60,(int)kids);
      bVar3 = QPDFObjectHandle::isDictionary(&local_60);
      bVar2 = true;
      goto LAB_0012ea78;
    }
  }
  bVar2 = false;
  bVar3 = false;
LAB_0012ea78:
  if ((bVar2) &&
     (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (bVar3 != false) {
    local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (key->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (key->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    QPDFObjectHandle::getArrayItem(&local_90,(int)kids);
    iVar4 = withinLimits(this,&local_a0,&local_90);
    if (local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    return iVar4;
  }
  __val = -idx;
  if (0 < idx) {
    __val = idx;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0012eb71;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0012eb71;
      }
      if (uVar6 < 10000) goto LAB_0012eb71;
      uVar8 = uVar8 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_0012eb71:
  qpdf = this->qpdf;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(idx >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + ((uint)idx >> 0x1f),__len,__val);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x2611b6);
  local_80._M_dataplus._M_p = (pointer)*plVar5;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_80._M_dataplus._M_p == psVar7) {
    local_80.field_2._M_allocated_capacity = *psVar7;
    local_80.field_2._8_8_ = plVar5[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar7;
  }
  local_80._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::error(qpdf,&this->oh,&local_80);
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
NNTreeImpl::compareKeyKid(QPDFObjectHandle& key, QPDFObjectHandle& kids, int idx)
{
    if (!(kids.isArray() && (idx < kids.getArrayNItems()) &&
          kids.getArrayItem(idx).isDictionary())) {
        QTC::TC("qpdf", "NNTree kid is invalid");
        error(qpdf, this->oh, "invalid kid at index " + std::to_string(idx));
    }
    return withinLimits(key, kids.getArrayItem(idx));
}